

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O1

void test_case_signed_div(zt_unit_test *test,void *data)

{
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  return;
}

Assistant:

static void
test_case_signed_div(struct zt_unit_test *test, void *data UNUSED)
{
    /* division */
    /* char */
    ZT_UNIT_ASSERT(test, zt_char_div(1, CHAR_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_char_div(CHAR_MAX, 1) == CHAR_MAX);

    ZT_UNIT_ASSERT(test, zt_char_div(1, CHAR_MIN) == 0);
    ZT_UNIT_ASSERT(test, zt_char_div(CHAR_MIN, 1) == CHAR_MIN);

    ZT_UNIT_ASSERT(test, zt_char_div(0, CHAR_MIN) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_char_div(CHAR_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_char_div(CHAR_MAX, 2) == CHAR_MAX / 2);
    ZT_UNIT_ASSERT(test, zt_char_div(2, CHAR_MAX) == 2 / CHAR_MAX);

    ZT_UNIT_ASSERT(test, zt_char_div(CHAR_MIN, 2) == CHAR_MIN / 2);
    ZT_UNIT_ASSERT(test, zt_char_div(2, CHAR_MIN) == 2 / CHAR_MIN);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_div(CHAR_MIN, -1)); */

    /* short */
    ZT_UNIT_ASSERT(test, zt_short_div(1, SHORT_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_short_div(SHORT_MAX, 1) == SHORT_MAX);

    ZT_UNIT_ASSERT(test, zt_short_div(1, SHORT_MIN) == 0);
    ZT_UNIT_ASSERT(test, zt_short_div(SHORT_MIN, 1) == SHORT_MIN);

    ZT_UNIT_ASSERT(test, zt_short_div(0, SHORT_MIN) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_short_div(SHORT_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_short_div(SHORT_MAX, 2) == SHORT_MAX / 2);
    ZT_UNIT_ASSERT(test, zt_short_div(2, SHORT_MAX) == 2 / SHORT_MAX);

    ZT_UNIT_ASSERT(test, zt_short_div(SHORT_MIN, 2) == SHORT_MIN / 2);
    ZT_UNIT_ASSERT(test, zt_short_div(2, SHORT_MIN) == 2 / SHORT_MIN);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_div(SHORT_MIN, -1)); */

    /* int */
    ZT_UNIT_ASSERT(test, zt_int_div(1, INT_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_int_div(INT_MAX, 1) == INT_MAX);

    ZT_UNIT_ASSERT(test, zt_int_div(1, INT_MIN) == 0);
    ZT_UNIT_ASSERT(test, zt_int_div(INT_MIN, 1) == INT_MIN);

    ZT_UNIT_ASSERT(test, zt_int_div(0, INT_MIN) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_int_div(INT_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_int_div(INT_MAX, 2) == INT_MAX / 2);
    ZT_UNIT_ASSERT(test, zt_int_div(2, INT_MAX) == 2 / INT_MAX);

    ZT_UNIT_ASSERT(test, zt_int_div(INT_MIN, 2) == INT_MIN / 2);
    ZT_UNIT_ASSERT(test, zt_int_div(2, INT_MIN) == 2 / INT_MIN);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_div(INT_MIN, -1)); */

# ifndef __x86_64__
    /* long */
    ZT_UNIT_ASSERT(test, zt_long_div(1, LONG_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_long_div(LONG_MAX, 1) == LONG_MAX);

    ZT_UNIT_ASSERT(test, zt_long_div(1, LONG_MIN) == 0);
    ZT_UNIT_ASSERT(test, zt_long_div(LONG_MIN, 1) == LONG_MIN);

    ZT_UNIT_ASSERT(test, zt_long_div(0, LONG_MIN) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_long_div(LONG_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_long_div(LONG_MAX, 2) == LONG_MAX / 2);
    ZT_UNIT_ASSERT(test, zt_long_div(2, LONG_MAX) == 2 / LONG_MAX);

    ZT_UNIT_ASSERT(test, zt_long_div(LONG_MIN, 2) == LONG_MIN / 2);
    ZT_UNIT_ASSERT(test, zt_long_div(2, LONG_MIN) == 2 / LONG_MIN);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_div(LONG_MIN, -1)); */
# endif /* ifndef __x86_64__ */
}